

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.cpp
# Opt level: O0

void __thiscall
vectorgraphics::Polygon3D::Polygon3D
          (Polygon3D *this,
          vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
          *point_ptrs)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  value_type local_50;
  value_type local_40;
  ulong local_30;
  size_t index;
  vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  *local_18;
  vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  *point_ptrs_local;
  Polygon3D *this_local;
  
  local_18 = point_ptrs;
  point_ptrs_local =
       (vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
        *)this;
  Primitive::Primitive(&this->super_Primitive);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ::vector(&this->line_segment_ptrs_);
  std::
  vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ::vector(&this->point_ptrs_,point_ptrs);
  local_30 = 1;
  while( true ) {
    uVar1 = local_30;
    sVar2 = std::
            vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
            ::size(&this->point_ptrs_);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
             ::operator[](&this->point_ptrs_,local_30 - 1);
    std::
    vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
    ::operator[](&this->point_ptrs_,local_30);
    std::
    make_shared<vectorgraphics::LineSegment3D,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
              ((shared_ptr<vectorgraphics::Point3D> *)&local_40,pvVar3);
    std::
    vector<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
    ::push_back(&this->line_segment_ptrs_,&local_40);
    std::shared_ptr<vectorgraphics::LineSegment3D>::~shared_ptr(&local_40);
    local_30 = local_30 + 1;
  }
  pvVar3 = std::
           vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
           ::operator[](&this->point_ptrs_,local_30 - 1);
  std::
  vector<std::shared_ptr<vectorgraphics::Point3D>,_std::allocator<std::shared_ptr<vectorgraphics::Point3D>_>_>
  ::operator[](&this->point_ptrs_,0);
  std::
  make_shared<vectorgraphics::LineSegment3D,std::shared_ptr<vectorgraphics::Point3D>&,std::shared_ptr<vectorgraphics::Point3D>&>
            ((shared_ptr<vectorgraphics::Point3D> *)&local_50,pvVar3);
  std::
  vector<std::shared_ptr<vectorgraphics::LineSegment3D>,_std::allocator<std::shared_ptr<vectorgraphics::LineSegment3D>_>_>
  ::push_back(&this->line_segment_ptrs_,&local_50);
  std::shared_ptr<vectorgraphics::LineSegment3D>::~shared_ptr(&local_50);
  return;
}

Assistant:

Polygon3D::Polygon3D(std::vector<Point3DPtr> point_ptrs) :
    point_ptrs_(point_ptrs) {
    size_t index=1;
    while(index < point_ptrs_.size()) {
      line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[index]));
      index += 1;
    }
    line_segment_ptrs_.push_back(std::make_shared<LineSegment3D>(point_ptrs_[index-1], point_ptrs_[0]));
  }